

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::DescriptorProto::SerializeWithCachedSizesToArray
          (DescriptorProto *this,uint8 *target)

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  char *data;
  string *str;
  FieldDescriptorProto *pFVar4;
  uint8 *puVar5;
  DescriptorProto *this_00;
  EnumDescriptorProto *this_01;
  DescriptorProto_ExtensionRange *this_02;
  MessageOptions *this_03;
  UnknownFieldSet *pUVar6;
  int local_1ec;
  int local_1e8;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  uint8 *target_local;
  DescriptorProto *this_local;
  uint8 *local_a0;
  byte *local_88;
  byte *local_70;
  byte *local_58;
  byte *local_40;
  byte *local_28;
  byte *local_10;
  
  bVar1 = has_name(this);
  _i_1 = target;
  if (bVar1) {
    name_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(data,iVar2,SERIALIZE);
    str = name_abi_cxx11_(this);
    uVar3 = internal::WireFormatLite::MakeTag(1,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *target = (byte)uVar3;
      local_a0 = target + 1;
    }
    else if (uVar3 < 0x4000) {
      *target = (byte)uVar3 | 0x80;
      target[1] = (uint8)(uVar3 >> 7);
      local_a0 = target + 2;
    }
    else {
      local_a0 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,target);
    }
    uVar3 = std::__cxx11::string::size();
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_a0);
    _i_1 = io::CodedOutputStream::WriteStringToArray(str,puVar5);
  }
  for (i_2 = 0; iVar2 = field_size(this), i_2 < iVar2; i_2 = i_2 + 1) {
    pFVar4 = field(this,i_2);
    uVar3 = internal::WireFormatLite::MakeTag(2,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *_i_1 = (byte)uVar3;
      local_40 = _i_1 + 1;
    }
    else if (uVar3 < 0x4000) {
      *_i_1 = (byte)uVar3 | 0x80;
      _i_1[1] = (byte)(uVar3 >> 7);
      local_40 = _i_1 + 2;
    }
    else {
      local_40 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,_i_1);
    }
    uVar3 = FieldDescriptorProto::GetCachedSize(pFVar4);
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_40);
    _i_1 = FieldDescriptorProto::SerializeWithCachedSizesToArray(pFVar4,puVar5);
  }
  for (i_3 = 0; iVar2 = nested_type_size(this), i_3 < iVar2; i_3 = i_3 + 1) {
    this_00 = nested_type(this,i_3);
    uVar3 = internal::WireFormatLite::MakeTag(3,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *_i_1 = (byte)uVar3;
      local_88 = _i_1 + 1;
    }
    else if (uVar3 < 0x4000) {
      *_i_1 = (byte)uVar3 | 0x80;
      _i_1[1] = (byte)(uVar3 >> 7);
      local_88 = _i_1 + 2;
    }
    else {
      local_88 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,_i_1);
    }
    uVar3 = GetCachedSize(this_00);
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_88);
    _i_1 = SerializeWithCachedSizesToArray(this_00,puVar5);
  }
  for (i_4 = 0; iVar2 = enum_type_size(this), i_4 < iVar2; i_4 = i_4 + 1) {
    this_01 = enum_type(this,i_4);
    uVar3 = internal::WireFormatLite::MakeTag(4,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *_i_1 = (byte)uVar3;
      local_70 = _i_1 + 1;
    }
    else if (uVar3 < 0x4000) {
      *_i_1 = (byte)uVar3 | 0x80;
      _i_1[1] = (byte)(uVar3 >> 7);
      local_70 = _i_1 + 2;
    }
    else {
      local_70 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,_i_1);
    }
    uVar3 = EnumDescriptorProto::GetCachedSize(this_01);
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_70);
    _i_1 = EnumDescriptorProto::SerializeWithCachedSizesToArray(this_01,puVar5);
  }
  for (local_1e8 = 0; iVar2 = extension_range_size(this), local_1e8 < iVar2;
      local_1e8 = local_1e8 + 1) {
    this_02 = extension_range(this,local_1e8);
    uVar3 = internal::WireFormatLite::MakeTag(5,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *_i_1 = (byte)uVar3;
      local_28 = _i_1 + 1;
    }
    else if (uVar3 < 0x4000) {
      *_i_1 = (byte)uVar3 | 0x80;
      _i_1[1] = (byte)(uVar3 >> 7);
      local_28 = _i_1 + 2;
    }
    else {
      local_28 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,_i_1);
    }
    uVar3 = DescriptorProto_ExtensionRange::GetCachedSize(this_02);
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_28);
    _i_1 = DescriptorProto_ExtensionRange::SerializeWithCachedSizesToArray(this_02,puVar5);
  }
  for (local_1ec = 0; iVar2 = extension_size(this), local_1ec < iVar2; local_1ec = local_1ec + 1) {
    pFVar4 = extension(this,local_1ec);
    uVar3 = internal::WireFormatLite::MakeTag(6,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *_i_1 = (byte)uVar3;
      local_58 = _i_1 + 1;
    }
    else if (uVar3 < 0x4000) {
      *_i_1 = (byte)uVar3 | 0x80;
      _i_1[1] = (byte)(uVar3 >> 7);
      local_58 = _i_1 + 2;
    }
    else {
      local_58 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,_i_1);
    }
    uVar3 = FieldDescriptorProto::GetCachedSize(pFVar4);
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_58);
    _i_1 = FieldDescriptorProto::SerializeWithCachedSizesToArray(pFVar4,puVar5);
  }
  bVar1 = has_options(this);
  if (bVar1) {
    this_03 = options(this);
    uVar3 = internal::WireFormatLite::MakeTag(7,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *_i_1 = (byte)uVar3;
      local_10 = _i_1 + 1;
    }
    else if (uVar3 < 0x4000) {
      *_i_1 = (byte)uVar3 | 0x80;
      _i_1[1] = (byte)(uVar3 >> 7);
      local_10 = _i_1 + 2;
    }
    else {
      local_10 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,_i_1);
    }
    uVar3 = MessageOptions::GetCachedSize(this_03);
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_10);
    _i_1 = MessageOptions::SerializeWithCachedSizesToArray(this_03,puVar5);
  }
  pUVar6 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar6);
  if (!bVar1) {
    pUVar6 = unknown_fields(this);
    _i_1 = internal::WireFormat::SerializeUnknownFieldsToArray(pUVar6,_i_1);
  }
  return _i_1;
}

Assistant:

::google::protobuf::uint8* DescriptorProto::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // repeated .google.protobuf.FieldDescriptorProto field = 2;
  for (int i = 0; i < this->field_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        2, this->field(i), target);
  }

  // repeated .google.protobuf.DescriptorProto nested_type = 3;
  for (int i = 0; i < this->nested_type_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        3, this->nested_type(i), target);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
  for (int i = 0; i < this->enum_type_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        4, this->enum_type(i), target);
  }

  // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
  for (int i = 0; i < this->extension_range_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        5, this->extension_range(i), target);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 6;
  for (int i = 0; i < this->extension_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        6, this->extension(i), target);
  }

  // optional .google.protobuf.MessageOptions options = 7;
  if (has_options()) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        7, this->options(), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}